

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usbcam.cpp
# Opt level: O0

void frame(void)

{
  int iVar1;
  int *piVar2;
  fd_set *__arr;
  uint __i;
  int r;
  timeval tv;
  fd_set fds;
  
LAB_0012927b:
  do {
    for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
      fds.fds_bits[(ulong)(uint)__arr - 1] = 0;
    }
    fds.fds_bits[(long)(fd / 0x40) + -1] =
         1L << ((byte)((long)fd % 0x40) & 0x3f) | fds.fds_bits[(long)(fd / 0x40) + -1];
    ___i = 2;
    tv.tv_sec = 0;
    iVar1 = select(fd + 1,(fd_set *)&tv.tv_usec,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&__i);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      if (*piVar2 == 4) goto LAB_0012927b;
      errno_exit("select");
    }
    if (iVar1 == 0) {
      fprintf(_stderr,"select timeout\n");
      errno_exit(1);
    }
    iVar1 = read_frame();
    if (iVar1 != 0) {
      return;
    }
  } while( true );
}

Assistant:

static void
frame                        (void)
{
    for (;;) {
        fd_set fds;
        struct timeval tv;
        int r;

        FD_ZERO (&fds);
        FD_SET (fd, &fds);

        /* Timeout. */
        tv.tv_sec = 2;
        tv.tv_usec = 0;

        r = select (fd + 1, &fds, NULL, NULL, &tv);

        if (-1 == r) {
            if (EINTR == errno)
                continue;

            errno_exit ("select");
        }

        if (0 == r) {
            fprintf (stderr, "select timeout\n");
            errno_exit (EXIT_FAILURE);
        }

        if (read_frame ())
            break;

        /* EAGAIN - continue select loop. */
    }
}